

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyAppendToClassAttr(TidyDocImpl *doc,AttVal *classattr,ctmbstr classname)

{
  uint uVar1;
  uint uVar2;
  tmbstr s1;
  
  uVar1 = prvTidytmbstrlen(classattr->value);
  uVar2 = prvTidytmbstrlen(classname);
  s1 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)(uVar1 + uVar2 + 2));
  *s1 = '\0';
  if (classattr->value != (ctmbstr)0x0) {
    prvTidytmbstrcpy(s1,classattr->value);
    prvTidytmbstrcat(s1," ");
  }
  prvTidytmbstrcat(s1,classname);
  if (classattr->value != (tmbstr)0x0) {
    (*doc->allocator->vtbl->free)(doc->allocator,classattr->value);
  }
  classattr->value = s1;
  return;
}

Assistant:

void TY_(AppendToClassAttr)( TidyDocImpl* doc, AttVal *classattr, ctmbstr classname )
{
    uint len = TY_(tmbstrlen)(classattr->value) +
        TY_(tmbstrlen)(classname) + 2;
    tmbstr s = (tmbstr) TidyDocAlloc( doc, len );
    s[0] = '\0';
    if (classattr->value)
    {
        TY_(tmbstrcpy)( s, classattr->value );
        TY_(tmbstrcat)( s, " " );
    }
    TY_(tmbstrcat)( s, classname );
    if (classattr->value)
        TidyDocFree( doc, classattr->value );
    classattr->value = s;
}